

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O0

void __thiscall
duckdb::StreamingWindowState::Initialize
          (StreamingWindowState *this,ClientContext *context,DataChunk *input,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *expressions)

{
  initializer_list<duckdb::LogicalType> iVar1;
  undefined8 uVar2;
  ExpressionType EVar3;
  size_type sVar4;
  pointer pLVar5;
  unsigned_long uVar6;
  DataChunk *this_00;
  idx_t capacity_p;
  __uniq_ptr_impl<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_> in_RCX;
  vector<duckdb::LogicalType,_true> *in_RSI;
  long in_RDI;
  int64_t offset;
  DataChunk result;
  ExpressionExecutor executor;
  BoundWindowExpression *wexpr;
  Expression *expr;
  idx_t expr_idx;
  DataChunk *in_stack_fffffffffffffcb8;
  ExpressionExecutor *in_stack_fffffffffffffcc0;
  ClientContext *in_stack_fffffffffffffcc8;
  ClientContext *context_00;
  size_type in_stack_fffffffffffffcd0;
  DataChunk *in_stack_fffffffffffffcd8;
  BoundWindowExpression *in_stack_fffffffffffffce0;
  ClientContext *in_stack_fffffffffffffce8;
  ExpressionExecutor *in_stack_fffffffffffffcf0;
  Expression *in_stack_fffffffffffffcf8;
  ExpressionExecutor *in_stack_fffffffffffffd00;
  DataChunk *in_stack_fffffffffffffd08;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffd10;
  Allocator *in_stack_fffffffffffffd18;
  DataChunk *in_stack_fffffffffffffd20;
  undefined1 ***local_2b0;
  undefined1 local_240 [136];
  DataChunk local_1b8 [2];
  undefined8 **local_120;
  undefined1 **local_118 [3];
  undefined8 **local_100;
  idx_t local_f8;
  BoundWindowExpression *local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_30;
  _Head_base<0UL,_duckdb::ClientData_*,_false> local_20;
  vector<duckdb::LogicalType,_true> *local_10;
  
  local_20._M_head_impl =
       (ClientData *)
       in_RCX._M_t.
       super__Tuple_impl<0UL,_duckdb::ClientData_*,_std::default_delete<duckdb::ClientData>_>.
       super__Head_base<0UL,_duckdb::ClientData_*,_false>._M_head_impl;
  local_10 = in_RSI;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          *)in_RCX._M_t.
            super__Tuple_impl<0UL,_duckdb::ClientData_*,_std::default_delete<duckdb::ClientData>_>.
            super__Head_base<0UL,_duckdb::ClientData_*,_false>._M_head_impl);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ::resize((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          *)local_20._M_head_impl);
  ::std::
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>_>_>
  ::resize((vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>_>_>
            *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          *)local_20._M_head_impl);
  ::std::
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>_>_>
  ::resize((vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>_>_>
            *)in_stack_fffffffffffffce0,(size_type)in_stack_fffffffffffffcd8);
  for (local_30._8_8_ = 0; uVar2 = local_30._8_8_,
      sVar4 = ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      *)local_20._M_head_impl), (ulong)uVar2 < sVar4;
      local_30._8_8_ = local_30._8_8_ + 1) {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
    local_30._M_allocated_capacity =
         (size_type)
         unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                   ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )in_stack_fffffffffffffcc0);
    local_38 = BaseExpression::Cast<duckdb::BoundWindowExpression>
                         ((BaseExpression *)in_stack_fffffffffffffd00);
    EVar3 = BaseExpression::GetExpressionType((BaseExpression *)local_30._M_allocated_capacity);
    if (EVar3 == WINDOW_FIRST_VALUE) {
      ExpressionExecutor::ExpressionExecutor(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffcc0);
      ExpressionExecutor::AddExpression(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      DataChunk::DataChunk((DataChunk *)in_stack_fffffffffffffcc0);
      Allocator::Get((ClientContext *)0x1728967);
      local_120 = local_118;
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffcc0);
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffffcc0,(LogicalType *)in_stack_fffffffffffffcb8);
      local_100 = local_118;
      local_f8 = 1;
      ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x1728a03);
      iVar1._M_len = in_stack_fffffffffffffcd0;
      iVar1._M_array = (iterator)in_stack_fffffffffffffcc8;
      vector<duckdb::LogicalType,_true>::vector
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffcc0,iVar1,
                 (allocator_type *)in_stack_fffffffffffffcb8);
      DataChunk::Initialize
                (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                 (idx_t)in_stack_fffffffffffffd08);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1728a5b);
      ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x1728a68)
      ;
      local_2b0 = (undefined1 ***)&local_100;
      do {
        local_2b0 = local_2b0 + -3;
        LogicalType::~LogicalType((LogicalType *)0x1728a9d);
      } while (local_2b0 != local_118);
      ExpressionExecutor::Execute
                (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,(DataChunk *)0x1728ad7);
      DataChunk::GetValue(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                          (idx_t)in_stack_fffffffffffffcc8);
      make_uniq<duckdb::Vector,duckdb::Value>((Value *)in_stack_fffffffffffffcd8);
      vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>::
      operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
      unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator=
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                 in_stack_fffffffffffffcc0,
                 (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                 in_stack_fffffffffffffcb8);
      unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)0x1728b53)
      ;
      Value::~Value((Value *)in_stack_fffffffffffffcc0);
      DataChunk::~DataChunk((DataChunk *)in_stack_fffffffffffffcc0);
      ExpressionExecutor::~ExpressionExecutor(in_stack_fffffffffffffcc0);
    }
    else if ((byte)(EVar3 + WINDOW_CUME_DIST) < 2) {
      make_uniq<duckdb::StreamingWindowState::LeadLagState,duckdb::ClientContext&,duckdb::BoundWindowExpression&>
                (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
      in_stack_fffffffffffffce8 =
           (ClientContext *)
           vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
                         *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
      unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>
      ::operator=((unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>
                   *)in_stack_fffffffffffffcc0,
                  (unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>
                   *)in_stack_fffffffffffffcb8);
      unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>
      ::~unique_ptr((unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>
                     *)0x1728ed8);
      vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
                    *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
      pLVar5 = unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>
               ::operator->((unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>
                             *)in_stack_fffffffffffffcc0);
      local_240._48_8_ = pLVar5->offset;
      if ((long)local_240._48_8_ < 0) {
        uVar6 = MaxValue<unsigned_long>(-local_240._48_8_,*(unsigned_long *)(in_RDI + 0x60));
        *(unsigned_long *)(in_RDI + 0x60) = uVar6;
      }
    }
    else if (EVar3 == WINDOW_AGGREGATE) {
      make_uniq<duckdb::StreamingWindowState::AggregateState,duckdb::ClientContext&,duckdb::BoundWindowExpression&,duckdb::Allocator&>
                (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                 (Allocator *)in_stack_fffffffffffffcd8);
      vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_true>
                    *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
      unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>
      ::operator=((unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>
                   *)in_stack_fffffffffffffcc0,
                  (unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>
                   *)in_stack_fffffffffffffcb8);
      unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>
      ::~unique_ptr((unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>
                     *)0x17288be);
    }
    else if ((byte)(EVar3 + 0x88) < 2) {
      in_stack_fffffffffffffcf8 = (Expression *)(local_240 + 0x40);
      Value::Value((Value *)in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8);
      make_uniq<duckdb::Vector,duckdb::Value>((Value *)in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffcf0 =
           (ExpressionExecutor *)
           vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                         *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
      unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator=
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                 in_stack_fffffffffffffcc0,
                 (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                 in_stack_fffffffffffffcb8);
      unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)0x1728e21)
      ;
      Value::~Value((Value *)in_stack_fffffffffffffcc0);
    }
    else if (EVar3 == WINDOW_PERCENT_RANK) {
      in_stack_fffffffffffffd08 = local_1b8;
      Value::Value((Value *)in_stack_fffffffffffffce0,(double)in_stack_fffffffffffffcd8);
      make_uniq<duckdb::Vector,duckdb::Value>((Value *)in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffd00 =
           (ExpressionExecutor *)
           vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                         *)in_stack_fffffffffffffcc0,(size_type)in_stack_fffffffffffffcb8);
      unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator=
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                 in_stack_fffffffffffffcc0,
                 (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                 in_stack_fffffffffffffcb8);
      unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)0x1728d5c)
      ;
      Value::~Value((Value *)in_stack_fffffffffffffcc0);
    }
  }
  if (*(long *)(in_RDI + 0x60) != 0) {
    this_00 = (DataChunk *)(in_RDI + 0x68);
    DataChunk::GetTypes(in_stack_fffffffffffffd08);
    DataChunk::Initialize
              (this_00,in_stack_fffffffffffffcc8,
               (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffcc0,
               (idx_t)in_stack_fffffffffffffcb8);
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1729004);
    capacity_p = in_RDI + 0xa8;
    context_00 = (ClientContext *)local_240;
    DataChunk::GetTypes(in_stack_fffffffffffffd08);
    DataChunk::Initialize(this_00,context_00,local_10,capacity_p);
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1729072);
  }
  *(undefined1 *)(in_RDI + 8) = 1;
  return;
}

Assistant:

void Initialize(ClientContext &context, DataChunk &input, const vector<unique_ptr<Expression>> &expressions) {
		const_vectors.resize(expressions.size());
		aggregate_states.resize(expressions.size());
		lead_lag_states.resize(expressions.size());

		for (idx_t expr_idx = 0; expr_idx < expressions.size(); expr_idx++) {
			auto &expr = *expressions[expr_idx];
			auto &wexpr = expr.Cast<BoundWindowExpression>();
			switch (expr.GetExpressionType()) {
			case ExpressionType::WINDOW_AGGREGATE:
				aggregate_states[expr_idx] = make_uniq<AggregateState>(context, wexpr, allocator);
				break;
			case ExpressionType::WINDOW_FIRST_VALUE: {
				// Just execute the expression once
				ExpressionExecutor executor(context);
				executor.AddExpression(*wexpr.children[0]);
				DataChunk result;
				result.Initialize(Allocator::Get(context), {wexpr.children[0]->return_type});
				executor.Execute(input, result);

				const_vectors[expr_idx] = make_uniq<Vector>(result.GetValue(0, 0));
				break;
			}
			case ExpressionType::WINDOW_PERCENT_RANK: {
				const_vectors[expr_idx] = make_uniq<Vector>(Value((double)0));
				break;
			}
			case ExpressionType::WINDOW_RANK:
			case ExpressionType::WINDOW_RANK_DENSE: {
				const_vectors[expr_idx] = make_uniq<Vector>(Value((int64_t)1));
				break;
			}
			case ExpressionType::WINDOW_LAG:
			case ExpressionType::WINDOW_LEAD: {
				lead_lag_states[expr_idx] = make_uniq<LeadLagState>(context, wexpr);
				const auto offset = lead_lag_states[expr_idx]->offset;
				if (offset < 0) {
					lead_count = MaxValue<idx_t>(idx_t(-offset), lead_count);
				}
				break;
			}
			default:
				break;
			}
		}
		if (lead_count) {
			delayed.Initialize(context, input.GetTypes(), lead_count + STANDARD_VECTOR_SIZE);
			shifted.Initialize(context, input.GetTypes(), lead_count + STANDARD_VECTOR_SIZE);
		}
		initialized = true;
	}